

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv__udp_check_before_send(uv_udp_t *handle,sockaddr *addr)

{
  int local_24;
  uint addrlen;
  sockaddr *addr_local;
  uv_udp_t *handle_local;
  
  if (handle->type == UV_UDP) {
    if ((addr == (sockaddr *)0x0) || ((handle->flags & 0x2000000) == 0)) {
      if ((addr == (sockaddr *)0x0) && ((handle->flags & 0x2000000) == 0)) {
        handle_local._4_4_ = -0x59;
      }
      else {
        if (addr == (sockaddr *)0x0) {
          local_24 = 0;
        }
        else if (addr->sa_family == 2) {
          local_24 = 0x10;
        }
        else if (addr->sa_family == 10) {
          local_24 = 0x1c;
        }
        else {
          if (addr->sa_family != 1) {
            return -0x16;
          }
          local_24 = 0x6e;
        }
        handle_local._4_4_ = local_24;
      }
    }
    else {
      handle_local._4_4_ = -0x6a;
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_check_before_send(uv_udp_t* handle, const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  if (addr != NULL && (handle->flags & UV_HANDLE_UDP_CONNECTED))
    return UV_EISCONN;

  if (addr == NULL && !(handle->flags & UV_HANDLE_UDP_CONNECTED))
    return UV_EDESTADDRREQ;

  if (addr != NULL) {
    if (addr->sa_family == AF_INET)
      addrlen = sizeof(struct sockaddr_in);
    else if (addr->sa_family == AF_INET6)
      addrlen = sizeof(struct sockaddr_in6);
#if defined(AF_UNIX) && !defined(_WIN32)
    else if (addr->sa_family == AF_UNIX)
      addrlen = sizeof(struct sockaddr_un);
#endif
    else
      return UV_EINVAL;
  } else {
    addrlen = 0;
  }

  return addrlen;
}